

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clogger.h
# Opt level: O2

void __thiscall CLogger::Warn<char_const*&>(CLogger *this,string_view fmt,char **args)

{
  format_string_t<const_char_*&> fmt_00;
  logger *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  spdlog::get((char *)&local_30);
  fmt_00.str_.size_ = fmt._M_len;
  fmt_00.str_.data_ = fmt._M_str;
  spdlog::logger::warn<char_const*&>(local_30,fmt_00,args);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return;
}

Assistant:

void Warn(std::string_view fmt, Args &&...args)
	{
		spdlog::get("rs")->warn(fmt, std::forward<Args>(args)...);
	}